

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HEkkPrimal.cpp
# Opt level: O0

void __thiscall HEkkPrimal::phase1UpdatePrimal(HEkkPrimal *this)

{
  double dVar1;
  double dVar2;
  int iVar3;
  int iVar4;
  long lVar5;
  reference pvVar6;
  reference pvVar7;
  long *in_RDI;
  double dVar8;
  double delta_cost;
  double cost;
  HighsInt bound_violated;
  double upper;
  double lower;
  double value;
  double was_cost;
  HighsInt iCol;
  HighsInt iRow;
  HighsInt iEl;
  double base;
  HighsSimplexInfo *info;
  double in_stack_ffffffffffffff68;
  undefined4 in_stack_ffffffffffffff70;
  int in_stack_ffffffffffffff74;
  int iVar9;
  HVectorBase<double> *in_stack_ffffffffffffff80;
  double dVar10;
  double local_58;
  uint local_4c;
  int local_1c;
  
  HighsSimplexAnalysis::simplexTimerStart
            ((HighsSimplexAnalysis *)CONCAT44(in_stack_ffffffffffffff74,in_stack_ffffffffffffff70),
             (HighsInt)((ulong)in_stack_ffffffffffffff68 >> 0x20),SUB84(in_stack_ffffffffffffff68,0)
            );
  lVar5 = *in_RDI;
  HVectorBase<double>::clear(in_stack_ffffffffffffff80);
  dVar8 = *(double *)(lVar5 + 0x2820) * 5e-07;
  for (local_1c = 0; local_1c < *(int *)((long)in_RDI + 0x35c); local_1c = local_1c + 1) {
    pvVar6 = std::vector<int,_std::allocator<int>_>::operator[]
                       ((vector<int,_std::allocator<int>_> *)(in_RDI + 0x6c),(long)local_1c);
    iVar9 = *pvVar6;
    dVar1 = (double)in_RDI[0xc];
    pvVar7 = std::vector<double,_std::allocator<double>_>::operator[]
                       ((vector<double,_std::allocator<double>_> *)(in_RDI + 0x6f),(long)iVar9);
    dVar10 = *pvVar7;
    pvVar7 = std::vector<double,_std::allocator<double>_>::operator[]
                       ((vector<double,_std::allocator<double>_> *)(lVar5 + 0x2668),(long)iVar9);
    *pvVar7 = -dVar1 * dVar10 + *pvVar7;
    pvVar6 = std::vector<int,_std::allocator<int>_>::operator[]
                       ((vector<int,_std::allocator<int>_> *)(*in_RDI + 0x2978),(long)iVar9);
    iVar3 = *pvVar6;
    pvVar7 = std::vector<double,_std::allocator<double>_>::operator[]
                       ((vector<double,_std::allocator<double>_> *)(lVar5 + 0x2560),(long)iVar3);
    dVar1 = *pvVar7;
    pvVar7 = std::vector<double,_std::allocator<double>_>::operator[]
                       ((vector<double,_std::allocator<double>_> *)(lVar5 + 0x2668),(long)iVar9);
    dVar10 = *pvVar7;
    pvVar7 = std::vector<double,_std::allocator<double>_>::operator[]
                       ((vector<double,_std::allocator<double>_> *)(lVar5 + 0x2638),(long)iVar9);
    dVar2 = *pvVar7;
    pvVar7 = std::vector<double,_std::allocator<double>_>::operator[]
                       ((vector<double,_std::allocator<double>_> *)(lVar5 + 0x2650),(long)iVar9);
    if (dVar2 - (double)in_RDI[5] <= dVar10) {
      local_4c = (uint)(*pvVar7 + (double)in_RDI[5] < dVar10);
    }
    else {
      local_4c = 0xffffffff;
    }
    local_58 = (double)(int)local_4c;
    if ((dVar8 != 0.0) || (NAN(dVar8))) {
      dVar10 = dVar8;
      pvVar7 = std::vector<double,_std::allocator<double>_>::operator[]
                         ((vector<double,_std::allocator<double>_> *)(lVar5 + 0x2680),(long)iVar9);
      local_58 = (dVar10 * *pvVar7 + 1.0) * local_58;
    }
    pvVar7 = std::vector<double,_std::allocator<double>_>::operator[]
                       ((vector<double,_std::allocator<double>_> *)(lVar5 + 0x2560),(long)iVar3);
    *pvVar7 = local_58;
    if ((dVar1 != 0.0) || (NAN(dVar1))) {
      if ((local_58 == 0.0) && (!NAN(local_58))) {
        *(int *)(lVar5 + 0x28d8) = *(int *)(lVar5 + 0x28d8) + -1;
      }
    }
    else if ((local_58 != 0.0) || (NAN(local_58))) {
      *(int *)(lVar5 + 0x28d8) = *(int *)(lVar5 + 0x28d8) + 1;
    }
    local_58 = local_58 - dVar1;
    if ((local_58 != 0.0) || (NAN(local_58))) {
      in_stack_ffffffffffffff68 = local_58;
      pvVar7 = std::vector<double,_std::allocator<double>_>::operator[]
                         ((vector<double,_std::allocator<double>_> *)(in_RDI + 0x85),(long)iVar9);
      *pvVar7 = in_stack_ffffffffffffff68;
      iVar4 = *(int *)((long)in_RDI + 0x40c);
      *(int *)((long)in_RDI + 0x40c) = iVar4 + 1;
      pvVar6 = std::vector<int,_std::allocator<int>_>::operator[]
                         ((vector<int,_std::allocator<int>_> *)(in_RDI + 0x82),(long)iVar4);
      *pvVar6 = iVar9;
      in_stack_ffffffffffffff74 = iVar9;
      if ((int)in_RDI[2] <= iVar3) {
        pvVar7 = std::vector<double,_std::allocator<double>_>::operator[]
                           ((vector<double,_std::allocator<double>_> *)(lVar5 + 0x2578),(long)iVar3)
        ;
        *pvVar7 = local_58 + *pvVar7;
        in_stack_ffffffffffffff74 = iVar9;
      }
    }
  }
  HEkk::invalidatePrimalMaxSumInfeasibilityRecord((HEkk *)*in_RDI);
  HighsSimplexAnalysis::simplexTimerStop
            ((HighsSimplexAnalysis *)CONCAT44(in_stack_ffffffffffffff74,in_stack_ffffffffffffff70),
             (HighsInt)((ulong)in_stack_ffffffffffffff68 >> 0x20),SUB84(in_stack_ffffffffffffff68,0)
            );
  return;
}

Assistant:

void HEkkPrimal::phase1UpdatePrimal() {
  analysis->simplexTimerStart(UpdatePrimalClock);
  HighsSimplexInfo& info = ekk_instance_.info_;
  col_basic_feasibility_change.clear();
  //
  // Update basic primal values, identifying all the feasibility
  // changes giving a value to col_basic_feasibility_change so that the duals
  // can be updated.
  //
  // Determine the base value for cost perturbation
  const double base =
      info.primal_simplex_phase1_cost_perturbation_multiplier * 5e-7;
  //  if (ekk_instance_.sparseLoopStyle(col_aq.count, num_row, to_entry)) {
  for (HighsInt iEl = 0; iEl < col_aq.count; iEl++) {
    HighsInt iRow = col_aq.index[iEl];
    info.baseValue_[iRow] -= theta_primal * col_aq.array[iRow];
    HighsInt iCol = ekk_instance_.basis_.basicIndex_[iRow];
    double was_cost = info.workCost_[iCol];
    const double value = info.baseValue_[iRow];
    const double lower = info.baseLower_[iRow];
    const double upper = info.baseUpper_[iRow];
    HighsInt bound_violated = 0;
    if (value < lower - primal_feasibility_tolerance) {
      bound_violated = -1.0;
    } else if (value > upper + primal_feasibility_tolerance) {
      bound_violated = 1.0;
    }
    double cost = bound_violated;
    if (base) cost *= 1 + base * info.numTotRandomValue_[iRow];
    info.workCost_[iCol] = cost;
    if (was_cost) {
      if (!cost) info.num_primal_infeasibilities--;
    } else {
      if (cost) info.num_primal_infeasibilities++;
    }
    double delta_cost = cost - was_cost;
    if (delta_cost) {
      col_basic_feasibility_change.array[iRow] = delta_cost;
      col_basic_feasibility_change.index[col_basic_feasibility_change.count++] =
          iRow;
      if (iCol >= num_col) info.workDual_[iCol] += delta_cost;
    }
  }
  // Don't set baseValue[row_out] yet so that dual update due to
  // feasibility changes is done correctly
  ekk_instance_.invalidatePrimalMaxSumInfeasibilityRecord();
  analysis->simplexTimerStop(UpdatePrimalClock);
}